

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.c
# Opt level: O0

void mapping_merge(MemoryMapping *map,hwaddr virt_addr,ram_addr_t length)

{
  ram_addr_t length_local;
  hwaddr virt_addr_local;
  MemoryMapping *map_local;
  
  if (virt_addr < map->virt_addr) {
    map->length = (map->virt_addr - virt_addr) + map->length;
    map->virt_addr = virt_addr;
  }
  if (map->virt_addr + map->length < virt_addr + length) {
    map->length = (virt_addr + length) - map->virt_addr;
  }
  return;
}

Assistant:

static inline void mapping_merge(MemoryMapping *map,
                                 hwaddr virt_addr,
                                 ram_addr_t length)
{
    if (virt_addr < map->virt_addr) {
        map->length += map->virt_addr - virt_addr;
        map->virt_addr = virt_addr;
    }

    if ((virt_addr + length) >
        (map->virt_addr + map->length)) {
        map->length = virt_addr + length - map->virt_addr;
    }
}